

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

void Kit_TruthSwapAdjacentVars(uint *pOut,uint *pIn,int nVars,int iVar)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  uint *puVar13;
  uint *puVar14;
  uint *puVar15;
  uint *puVar16;
  
  uVar11 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  if (nVars < 6) {
    uVar11 = 1;
  }
  if (iVar < nVars + -1) {
    iVar10 = (int)uVar11;
    if (iVar < 4) {
      uVar9 = 0;
      if (iVar10 < 1) {
        uVar11 = 0;
      }
      for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        uVar1 = pIn[uVar9];
        bVar7 = (byte)(1 << ((byte)iVar & 0x1f));
        pOut[uVar9] = (uVar1 & Kit_TruthSwapAdjacentVars::PMasks[iVar][2]) >> (bVar7 & 0x1f) |
                      (Kit_TruthSwapAdjacentVars::PMasks[iVar][1] & uVar1) << (bVar7 & 0x1f) |
                      Kit_TruthSwapAdjacentVars::PMasks[iVar][0] & uVar1;
      }
    }
    else if (iVar == 4) {
      for (lVar3 = 0; lVar3 < iVar10; lVar3 = lVar3 + 2) {
        pOut[lVar3] = pIn[lVar3 + 1] << 0x10 | (uint)(ushort)pIn[lVar3];
        pOut[lVar3 + 1] =
             CONCAT22(*(undefined2 *)((long)pIn + lVar3 * 4 + 6),
                      *(undefined2 *)((long)pIn + lVar3 * 4 + 2));
      }
    }
    else {
      bVar7 = (byte)iVar - 5;
      uVar1 = 1 << (bVar7 & 0x1f);
      iVar12 = 2 << (bVar7 & 0x1f);
      iVar5 = 3 << (bVar7 & 0x1f);
      iVar4 = 4 << (bVar7 & 0x1f);
      iVar8 = 0;
      uVar11 = 0;
      if (0 < 1 << (bVar7 & 0x1f)) {
        uVar11 = (ulong)uVar1;
      }
      puVar2 = pIn + iVar12;
      puVar13 = pOut + (int)uVar1;
      puVar6 = pIn + (int)uVar1;
      puVar15 = pOut + iVar12;
      puVar16 = pIn + iVar5;
      puVar14 = pOut + iVar5;
      for (; iVar8 < iVar10; iVar8 = iVar8 + iVar4) {
        for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
          pOut[uVar9] = pIn[uVar9];
        }
        for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
          puVar13[uVar9] = puVar2[uVar9];
        }
        for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
          puVar15[uVar9] = puVar6[uVar9];
        }
        for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
          puVar14[uVar9] = puVar16[uVar9];
        }
        pOut = pOut + iVar4;
        pIn = pIn + iVar4;
        puVar2 = puVar2 + iVar4;
        puVar13 = puVar13 + iVar4;
        puVar6 = puVar6 + iVar4;
        puVar15 = puVar15 + iVar4;
        puVar16 = puVar16 + iVar4;
        puVar14 = puVar14 + iVar4;
      }
    }
    return;
  }
  __assert_fail("iVar < nVars - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitTruth.c"
                ,0x39,"void Kit_TruthSwapAdjacentVars(unsigned int *, unsigned int *, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Swaps two adjacent variables in the truth table.]

  Description [Swaps var number Start and var number Start+1 (0-based numbers).
  The input truth table is pIn. The output truth table is pOut.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Kit_TruthSwapAdjacentVars( unsigned * pOut, unsigned * pIn, int nVars, int iVar )
{
    static unsigned PMasks[4][3] = {
        { 0x99999999, 0x22222222, 0x44444444 },
        { 0xC3C3C3C3, 0x0C0C0C0C, 0x30303030 },
        { 0xF00FF00F, 0x00F000F0, 0x0F000F00 },
        { 0xFF0000FF, 0x0000FF00, 0x00FF0000 }
    };
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step, Shift;

    assert( iVar < nVars - 1 );
    if ( iVar < 4 )
    {
        Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & PMasks[iVar][0]) | ((pIn[i] & PMasks[iVar][1]) << Shift) | ((pIn[i] & PMasks[iVar][2]) >> Shift);
    }
    else if ( iVar > 4 )
    {
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 4*Step )
        {
            for ( i = 0; i < Step; i++ )
                pOut[i] = pIn[i];
            for ( i = 0; i < Step; i++ )
                pOut[Step+i] = pIn[2*Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[2*Step+i] = pIn[Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[3*Step+i] = pIn[3*Step+i];
            pIn  += 4*Step;
            pOut += 4*Step;
        }
    }
    else // if ( iVar == 4 )
    {
        for ( i = 0; i < nWords; i += 2 )
        {
            pOut[i]   = (pIn[i]   & 0x0000FFFF) | ((pIn[i+1] & 0x0000FFFF) << 16);
            pOut[i+1] = (pIn[i+1] & 0xFFFF0000) | ((pIn[i]   & 0xFFFF0000) >> 16);
        }
    }
}